

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

int array_container_shrink_to_fit(array_container_t *src)

{
  void *pvVar1;
  int *in_RDI;
  uint16_t *oldarray;
  int savings;
  size_t in_stack_ffffffffffffffd8;
  int local_4;
  
  if (*in_RDI == in_RDI[1]) {
    local_4 = 0;
  }
  else {
    local_4 = in_RDI[1] - *in_RDI;
    in_RDI[1] = *in_RDI;
    if (in_RDI[1] == 0) {
      roaring_free((void *)0x112ee2);
      in_RDI[2] = 0;
      in_RDI[3] = 0;
    }
    else {
      pvVar1 = roaring_realloc(*(void **)(in_RDI + 2),in_stack_ffffffffffffffd8);
      *(void **)(in_RDI + 2) = pvVar1;
      if (*(long *)(in_RDI + 2) == 0) {
        roaring_free((void *)0x112f37);
      }
    }
  }
  return local_4;
}

Assistant:

int array_container_shrink_to_fit(array_container_t *src) {
    if (src->cardinality == src->capacity) return 0;  // nothing to do
    int savings = src->capacity - src->cardinality;
    src->capacity = src->cardinality;
    if (src->capacity ==
        0) {  // we do not want to rely on realloc for zero allocs
        roaring_free(src->array);
        src->array = NULL;
    } else {
        uint16_t *oldarray = src->array;
        src->array = (uint16_t *)roaring_realloc(
            oldarray, src->capacity * sizeof(uint16_t));
        if (src->array == NULL) roaring_free(oldarray);  // should never happen?
    }
    return savings;
}